

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O2

void __thiscall TypesHierarchy::AddRelation(TypesHierarchy *this,TYPE_ID type,TYPE_ID parent)

{
  TYPE_ID local_c [2];
  TYPE_ID type_local;
  
  local_c[0] = type;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((this->types).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + parent,local_c);
  return;
}

Assistant:

void TypesHierarchy::AddRelation(TYPE_ID type, TYPE_ID parent) {
//	types[type].push_back(parent);
	types[parent].push_back(type);
}